

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataCastToArrayListGather
               (TupleDataLayout *layout,Vector *row_locations,idx_t col_idx,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> cached_cast_vector,
               vector<duckdb::TupleDataGatherFunction,_true> *child_functions)

{
  Vector *pVVar1;
  Vector cast_vector;
  optional_ptr<duckdb::Vector,_true> in_stack_ffffffffffffff30;
  optional_ptr<duckdb::Vector,_true> local_c0;
  Vector *local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  local_c0.ptr = cached_cast_vector.ptr;
  if (cached_cast_vector.ptr == (Vector *)0x0) {
    local_b8 = target;
    ArrayType::ConvertToList(&local_b0,&target->type);
    Vector::Vector(&local_98,&local_b0,0x800);
    LogicalType::~LogicalType(&local_b0);
    TupleDataListGather(layout,row_locations,col_idx,scan_sel,scan_count,&local_98,target_sel,
                        in_stack_ffffffffffffff30,child_functions);
    VectorOperations::DefaultCast(&local_98,local_b8,scan_count,false);
    Vector::~Vector(&local_98);
  }
  else {
    pVVar1 = optional_ptr<duckdb::Vector,_true>::operator*(&local_c0);
    TupleDataListGather(layout,row_locations,col_idx,scan_sel,scan_count,pVVar1,target_sel,
                        in_stack_ffffffffffffff30,child_functions);
    pVVar1 = optional_ptr<duckdb::Vector,_true>::operator*(&local_c0);
    VectorOperations::DefaultCast(pVVar1,target,scan_count,false);
  }
  return;
}

Assistant:

static void TupleDataCastToArrayListGather(const TupleDataLayout &layout, Vector &row_locations, const idx_t col_idx,
                                           const SelectionVector &scan_sel, const idx_t scan_count, Vector &target,
                                           const SelectionVector &target_sel, optional_ptr<Vector> cached_cast_vector,
                                           const vector<TupleDataGatherFunction> &child_functions) {
	if (cached_cast_vector) {
		// Reuse the cached cast vector
		TupleDataListGather(layout, row_locations, col_idx, scan_sel, scan_count, *cached_cast_vector, target_sel,
		                    cached_cast_vector, child_functions);
		VectorOperations::DefaultCast(*cached_cast_vector, target, scan_count);
	} else {
		// Otherwise, create a new temporary cast vector
		Vector cast_vector(ArrayType::ConvertToList(target.GetType()));
		TupleDataListGather(layout, row_locations, col_idx, scan_sel, scan_count, cast_vector, target_sel, &cast_vector,
		                    child_functions);
		VectorOperations::DefaultCast(cast_vector, target, scan_count);
	}
}